

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

char * __thiscall wabt::Type::GetName(Type *this)

{
  Type *this_local;
  
  switch(this->enum_) {
  case Any:
    this_local = (Type *)anon_var_dwarf_cc4e3;
    break;
  case Void:
    this_local = (Type *)anon_var_dwarf_cc4d8;
    break;
  default:
    this_local = (Type *)anon_var_dwarf_cc4ee;
    break;
  case Func:
    this_local = (Type *)0x2fb37b;
    break;
  case Exnref:
    this_local = (Type *)anon_var_dwarf_cbf2f;
    break;
  case Nullref:
    this_local = (Type *)anon_var_dwarf_80722;
    break;
  case Anyref:
    this_local = (Type *)anon_var_dwarf_8102f;
    break;
  case Funcref:
    this_local = (Type *)anon_var_dwarf_8062c;
    break;
  case I16:
    this_local = (Type *)anon_var_dwarf_cc4cd;
    break;
  case I8:
    this_local = (Type *)anon_var_dwarf_cc4c2;
    break;
  case V128:
    this_local = (Type *)anon_var_dwarf_80b00;
    break;
  case F64:
    this_local = (Type *)0x2faa47;
    break;
  case F32:
    this_local = (Type *)0x2fb792;
    break;
  case I64:
    this_local = (Type *)0x2fb956;
    break;
  case I32:
    this_local = (Type *)0x2fae79;
  }
  return (char *)this_local;
}

Assistant:

const char* GetName() const {
    switch (enum_) {
      case Type::I32:     return "i32";
      case Type::I64:     return "i64";
      case Type::F32:     return "f32";
      case Type::F64:     return "f64";
      case Type::V128:    return "v128";
      case Type::I8:      return "i8";
      case Type::I16:     return "i16";
      case Type::Funcref: return "funcref";
      case Type::Func:    return "func";
      case Type::Exnref:  return "exnref";
      case Type::Void:    return "void";
      case Type::Any:     return "any";
      case Type::Anyref:  return "anyref";
      case Type::Nullref: return "nullref";
      default:            return "<type_index>";
    }
  }